

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.h
# Opt level: O2

path * __thiscall mp::path::filename(path *__return_storage_ptr__,path *this)

{
  size_t sVar1;
  string asStack_38 [32];
  
  sVar1 = FindLastSep(this);
  if (sVar1 == 0xffffffffffffffff) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  }
  else {
    std::__cxx11::string::substr((ulong)asStack_38,(ulong)this);
    std::__cxx11::string::string((string *)__return_storage_ptr__,asStack_38);
    std::__cxx11::string::~string(asStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

path filename() const {
    size_t last_sep = FindLastSep();
    return last_sep == std::string::npos ?
        *this : path(str_.substr(last_sep + 1));
  }